

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::InvalidateAllPropertyGuards(ThreadContext *this)

{
  int iVar1;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *pWVar2;
  PropertyRecord *propertyRecord;
  int i_00;
  RecyclableData *pRVar3;
  Type *this_00;
  int previous;
  int i;
  long lVar4;
  
  pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  if (0 < (pRVar3->propertyGuards).count - (pRVar3->propertyGuards).freeCount) {
    this_00 = &pRVar3->propertyGuards;
    for (lVar4 = 0; lVar4 < this_00->size; lVar4 = lVar4 + 1) {
      iVar1 = (pRVar3->propertyGuards).buckets.ptr[lVar4];
      if (iVar1 != -1) {
        previous = -1;
        while (i_00 = iVar1, i_00 != -1) {
          pWVar2 = (pRVar3->propertyGuards).entries.ptr;
          propertyRecord =
               (PropertyRecord *)((pWVar2[i_00].key.ptr)->super_RecyclerWeakReferenceBase).strongRef
          ;
          if (propertyRecord == (PropertyRecord *)0x0) {
            iVar1 = pWVar2[i_00].next;
            JsUtil::
            WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
            ::RemoveEntry(this_00,i_00,previous,(uint)lVar4);
          }
          else {
            InvalidatePropertyGuardEntry(this,propertyRecord,pWVar2[i_00].value.ptr,true);
            iVar1 = pWVar2[i_00].next;
            previous = i_00;
          }
        }
      }
    }
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
    ::Clear(this_00);
    return;
  }
  return;
}

Assistant:

void
ThreadContext::InvalidateAllPropertyGuards()
{
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;
    if (guards.Count() > 0)
    {
        guards.Map([this](Js::PropertyRecord const * propertyRecord, PropertyGuardEntry* entry, const RecyclerWeakReference<const Js::PropertyRecord>* weakRef)
        {
            InvalidatePropertyGuardEntry(propertyRecord, entry, true);
        });

        guards.Clear();
    }
}